

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher>::MatchExpr
          (MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher> *this,float *arg,
          WithinRelMatcher *matcher,StringRef *matcherString)

{
  pointer pcVar1;
  double dVar2;
  size_type sVar3;
  int iVar4;
  
  iVar4 = (*(matcher->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase
            [3])(matcher);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR___cxa_pure_virtual_00262cf8;
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar4,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00260d38;
  this->m_arg = arg;
  (this->m_matcher).super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_002621d0;
  (this->m_matcher).super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus.
  _M_p = (pointer)&(this->m_matcher).super_MatcherBase<double>.super_MatcherUntypedBase.
                   m_cachedToString.field_2;
  pcVar1 = (matcher->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString,
             pcVar1,pcVar1 + (matcher->super_MatcherBase<double>).super_MatcherUntypedBase.
                             m_cachedToString._M_string_length);
  (this->m_matcher).super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_00262288;
  (this->m_matcher).super_MatcherBase<double>.super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_002622b8;
  dVar2 = matcher->m_epsilon;
  (this->m_matcher).m_target = matcher->m_target;
  (this->m_matcher).m_epsilon = dVar2;
  sVar3 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar3;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}